

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void build_impute_node<InputData<double,unsigned_long>&,WorkerMemory<ImputedData<unsigned_long,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace,
               InputData<double,_unsigned_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this;
  unsigned_long uVar1;
  WeighImpRows WVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pIVar5;
  pointer pdVar6;
  bool bVar7;
  bool bVar8;
  uchar *puVar9;
  int *piVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  ulong *puVar13;
  double *cat;
  ulong *key;
  size_t sVar14;
  ImputeNode *pIVar15;
  pointer pvVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  pointer puVar20;
  size_t sVar21;
  size_t col_1;
  ulong uVar22;
  size_t col;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  unsigned_long *puVar26;
  unsigned_long uVar27;
  long lVar28;
  size_t sVar29;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *prVar30;
  long lVar31;
  undefined4 uVar32;
  int iVar39;
  double dVar33;
  double *pdVar34;
  double dVar35;
  undefined4 uVar40;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double *pdVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  double dVar49;
  undefined1 auVar50 [16];
  double dVar52;
  undefined1 auVar53 [16];
  double dVar54;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar55;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  size_t ix;
  double __tmp;
  tuple<> local_b1;
  pointer local_b0;
  double *local_a8;
  ImputeNode *local_a0;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_98;
  vector<double,_std::allocator<double>_> *local_90;
  vector<double,_std::allocator<double>_> *local_88;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_80;
  double local_78;
  unsigned_long local_70;
  undefined1 local_68 [16];
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  size_t local_48;
  ModelParams *local_40;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_38;
  
  bVar7 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  bVar8 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_b0 = (pointer)CONCAT71(local_b0._1_7_,!bVar7 || !bVar8);
  local_a0 = imputer;
  local_50 = imputer_tree;
  local_48 = curr_depth;
  local_40 = model_params;
  if (bVar7 && bVar8) {
    lVar24 = (workspace->end - workspace->st) + 1;
    auVar36._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar36._0_8_ = lVar24;
    auVar36._12_4_ = 0x45300000;
    dVar35 = auVar36._8_8_ - 1.9342813113834067e+25;
    local_68._0_8_ = dVar35 + ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
    local_68._8_8_ = dVar35;
  }
  else {
    local_68._0_8_ =
         calculate_sum_weights<double>
                   (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                    &workspace->weights_arr,&workspace->weights_map);
    local_68._8_8_ = extraout_XMM0_Qb;
  }
  pIVar15 = local_a0;
  local_98._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_a0->num_sum,input_data->ncols_numeric,(value_type_conflict *)&local_98);
  local_90 = &pIVar15->num_weight;
  local_98._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_90,input_data->ncols_numeric,(value_type_conflict *)&local_98);
  this = &pIVar15->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this,input_data->ncols_categ);
  local_88 = &pIVar15->cat_weight;
  local_98._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_88,input_data->ncols_categ,(value_type_conflict *)&local_98);
  if ((pIVar15->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&pIVar15->num_sum);
  }
  if ((pIVar15->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_90)
    ;
  }
  if ((pIVar15->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(this);
  }
  if ((pIVar15->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pIVar15->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_88)
    ;
  }
  if (input_data->ncols_categ == 0) {
    uVar11 = 0;
  }
  else {
    lVar24 = 0;
    uVar25 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar24),(long)input_data->ncat[uVar25]);
      pvVar16 = (this->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar24 + 0x10) !=
          *(long *)((long)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar24 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar24));
      }
      uVar25 = uVar25 + 1;
      uVar11 = input_data->ncols_categ;
      lVar24 = lVar24 + 0x18;
    } while (uVar25 < uVar11);
  }
  auVar36 = _DAT_0036e1d0;
  uVar25 = input_data->ncols_numeric;
  dVar35 = (double)local_68._0_8_;
  if ((uVar11 != 0) || (input_data->Xc_indptr == (unsigned_long *)0x0 && uVar25 != 0)) {
    local_a8 = input_data->numeric_data;
    if ((char)local_b0 == '\0') {
      if (uVar25 != 0 && local_a8 != (double *)0x0) {
        puVar20 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar22 = workspace->st;
        uVar23 = workspace->end;
        sVar14 = input_data->nrows;
        pdVar3 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar19 = 0;
        do {
          dVar33 = 0.0;
          if (uVar22 <= uVar23) {
            pdVar4 = (local_a0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            lVar24 = 0;
            uVar18 = uVar22;
            do {
              uVar32 = SUB164(ZEXT816(0x4530000043300000),0);
              uVar40 = SUB164(ZEXT816(0x4530000043300000),4);
              dVar33 = auVar36._0_8_;
              dVar52 = auVar36._8_8_;
              if ((ulong)ABS(local_a8[sVar14 * uVar19 + puVar20[uVar18]]) < 0x7ff0000000000000) {
                lVar24 = lVar24 + 1;
                dVar49 = pdVar4[uVar19];
                auVar47._8_4_ = (int)((ulong)lVar24 >> 0x20);
                auVar47._0_8_ = lVar24;
                auVar47._12_4_ = uVar40;
                pdVar4[uVar19] =
                     (local_a8[sVar14 * uVar19 + puVar20[uVar18]] - dVar49) /
                     ((auVar47._8_8_ - dVar52) + ((double)CONCAT44(uVar32,(int)lVar24) - dVar33)) +
                     dVar49;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 <= uVar23);
            auVar46._8_4_ = (int)((ulong)lVar24 >> 0x20);
            auVar46._0_8_ = lVar24;
            auVar46._12_4_ = uVar40;
            dVar33 = (auVar46._8_8_ - dVar52) + ((double)CONCAT44(uVar32,(int)lVar24) - dVar33);
          }
          pdVar3[uVar19] = dVar33;
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar25);
      }
      piVar10 = input_data->categ_data;
      if (uVar11 != 0 && piVar10 != (int *)0x0) {
        puVar20 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar25 = workspace->st;
        uVar22 = workspace->end;
        sVar14 = input_data->nrows;
        pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar23 = 0;
        dVar33 = (double)DAT_0036e1d0;
        dVar52 = DAT_0036e1d0._8_8_;
        do {
          dVar49 = 0.0;
          if (uVar25 <= uVar22) {
            pvVar16 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar24 = 0;
            uVar19 = uVar25;
            do {
              lVar31 = (long)piVar10[sVar14 * uVar23 + puVar20[uVar19]];
              if (-1 < lVar31) {
                lVar24 = lVar24 + 1;
                lVar28 = *(long *)&pvVar16[uVar23].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar28 + lVar31 * 8) = *(double *)(lVar28 + lVar31 * 8) + 1.0;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 <= uVar22);
            auVar48._8_4_ = (int)((ulong)lVar24 >> 0x20);
            auVar48._0_8_ = lVar24;
            auVar48._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar49 = (auVar48._8_8_ - dVar52) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar24) - dVar33);
          }
          pdVar3[uVar23] = dVar49;
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar11);
      }
    }
    else {
      if (uVar25 != 0 && local_a8 != (double *)0x0) {
        local_80 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)&workspace->weights_map;
        uVar11 = workspace->end;
        uVar22 = 0;
        pIVar15 = local_a0;
        do {
          uVar23 = workspace->st;
          pdVar34 = (double *)0x0;
          if (uVar23 <= uVar11) {
            lVar24 = uVar23 * 8;
            auVar44 = ZEXT816(0);
            do {
              puVar20 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar31 = *(long *)((long)puVar20 + lVar24);
              dVar33 = input_data->numeric_data[lVar31 + input_data->nrows * uVar22];
              if ((ulong)ABS(dVar33) < 0x7ff0000000000000) {
                pdVar3 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar3) {
                  local_98._M_head_impl = (unsigned_long *)((long)puVar20 + lVar24);
                  local_b0 = (pointer)auVar44._0_8_;
                  local_a8 = pdVar34;
                  local_78 = dVar33;
                  pVar55 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     (local_80,local_98._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_98,(tuple<> *)&local_70
                                     );
                  puVar9 = (pVar55.first.m_bucket.m_bucket)->m_value + 8;
                  uVar11 = workspace->end;
                  dVar35 = (double)local_68._0_8_;
                  puVar20 = local_b0;
                  pdVar41 = local_a8;
                  dVar33 = local_78;
                }
                else {
                  puVar9 = (uchar *)(pdVar3 + lVar31);
                  puVar20 = (pointer)auVar44._0_8_;
                  pdVar41 = pdVar34;
                }
                dVar52 = *(double *)puVar9;
                pdVar3 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar3[uVar22] = dVar52 + pdVar3[uVar22];
                dVar33 = dVar33 * dVar52 - (double)puVar20;
                pdVar34 = (double *)((double)pdVar41 + dVar33);
                auVar44._0_8_ = ((double)pdVar34 - (double)pdVar41) - dVar33;
                auVar44._8_8_ = 0;
              }
              uVar23 = uVar23 + 1;
              lVar24 = lVar24 + 8;
            } while (uVar23 <= uVar11);
            uVar25 = input_data->ncols_numeric;
            pIVar15 = local_a0;
          }
          (pIVar15->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22] =
               (double)pdVar34 /
               (pIVar15->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar22 < uVar25);
        uVar11 = input_data->ncols_categ;
      }
      if ((uVar11 != 0) && (uVar25 = workspace->st, uVar25 <= workspace->end)) {
        do {
          local_70 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar25];
          pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar3) {
            local_98._M_head_impl = &local_70;
            pVar55 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_70,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
            puVar9 = (pVar55.first.m_bucket.m_bucket)->m_value + 8;
            uVar11 = input_data->ncols_categ;
            dVar35 = (double)local_68._0_8_;
          }
          else {
            puVar9 = (uchar *)(pdVar3 + local_70);
          }
          if (uVar11 != 0) {
            dVar33 = *(double *)puVar9;
            sVar14 = input_data->nrows;
            piVar10 = input_data->categ_data + local_70;
            pvVar16 = (this->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar22 = 0;
            do {
              lVar24 = (long)*piVar10;
              if (-1 < lVar24) {
                lVar31 = *(long *)&(pvVar16->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar31 + lVar24 * 8) = *(double *)(lVar31 + lVar24 * 8) + dVar33;
                pdVar3[uVar22] = pdVar3[uVar22] + dVar33;
              }
              uVar22 = uVar22 + 1;
              piVar10 = piVar10 + sVar14;
              pvVar16 = pvVar16 + 1;
            } while (uVar11 != uVar22);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 <= workspace->end);
      }
    }
  }
  auVar47 = _DAT_0036e1f0;
  auVar36 = _DAT_0036e1e0;
  if (input_data->Xc_indptr != (unsigned_long *)0x0) {
    local_a8 = (double *)
               (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      uVar11 = (long)pdVar4 + (-8 - (long)pdVar3);
      auVar37._8_4_ = (int)uVar11;
      auVar37._0_8_ = uVar11;
      auVar37._12_4_ = (int)(uVar11 >> 0x20);
      auVar38._0_8_ = uVar11 >> 3;
      auVar38._8_8_ = auVar37._8_8_ >> 3;
      uVar25 = 0;
      auVar38 = auVar38 ^ _DAT_0036e1f0;
      do {
        auVar45._8_4_ = (int)uVar25;
        auVar45._0_8_ = uVar25;
        auVar45._12_4_ = (int)(uVar25 >> 0x20);
        auVar46 = (auVar45 | auVar36) ^ auVar47;
        bVar7 = auVar38._0_4_ < auVar46._0_4_;
        iVar39 = auVar38._4_4_;
        iVar51 = auVar46._4_4_;
        if ((bool)(~(iVar39 < iVar51 || iVar51 == iVar39 && bVar7) & 1)) {
          pdVar3[uVar25] = dVar35;
        }
        if (iVar39 >= iVar51 && (iVar51 != iVar39 || !bVar7)) {
          pdVar3[uVar25 + 1] = dVar35;
        }
        uVar25 = uVar25 + 2;
      } while (((uVar11 >> 3) + 2 & 0xfffffffffffffffe) != uVar25);
    }
    sVar14 = input_data->ncols_numeric;
    if (sVar14 != 0) {
      puVar20 = (pointer)local_a8 + 1;
      local_38 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      sVar17 = workspace->end;
      uVar11 = 0;
      local_b0 = puVar20;
      do {
        puVar12 = input_data->Xc_ind;
        uVar27 = input_data->Xc_indptr[uVar11];
        key = (ulong *)(local_a8 + workspace->st);
        puVar13 = puVar20 + sVar17;
        uVar25 = (long)puVar13 - (long)key >> 3;
        if (0 < (long)uVar25) {
          do {
            uVar22 = uVar25 >> 1;
            uVar23 = ~uVar22 + uVar25;
            uVar25 = uVar22;
            if ((key + uVar22 + 1)[-1] < puVar12[uVar27]) {
              key = key + uVar22 + 1;
              uVar25 = uVar23;
            }
          } while (0 < (long)uVar25);
        }
        puVar20 = local_b0;
        if ((key != puVar13) &&
           (prVar30 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                       *)input_data->Xc_indptr[uVar11 + 1],
           (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
            *)uVar27 != prVar30)) {
          uVar25 = puVar12[(long)prVar30 - 1];
          uVar22 = *key;
          if (uVar22 <= uVar25) {
            uVar1 = (long)prVar30 - 1;
            local_80 = prVar30;
            do {
              uVar23 = puVar12[uVar27];
              if (uVar23 == uVar22) {
                local_78 = input_data->Xc[uVar27];
                pdVar3 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar3) {
                  dVar33 = 1.0;
                  if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                    local_98._M_head_impl = key;
                    pVar55 = tsl::detail_robin_hash::
                             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             ::
                             insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                       (local_38,key,
                                        (piecewise_construct_t *)&std::piecewise_construct,
                                        (tuple<const_unsigned_long_&> *)&local_98,&local_b1);
                    puVar9 = (pVar55.first.m_bucket.m_bucket)->m_value + 8;
                    puVar20 = local_b0;
                    prVar30 = local_80;
                    dVar35 = (double)local_68._0_8_;
                    goto LAB_00224919;
                  }
                }
                else {
                  puVar9 = (uchar *)(pdVar3 + uVar22);
LAB_00224919:
                  dVar33 = *(double *)puVar9;
                }
                if ((ulong)ABS(local_78) < 0x7ff0000000000000) {
                  pdVar3 = (local_a0->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar3[uVar11] = dVar33 * local_78 + pdVar3[uVar11];
                }
                else {
                  pdVar3 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  pdVar3[uVar11] = pdVar3[uVar11] - dVar33;
                }
                sVar17 = workspace->end;
                if (((double *)key == local_a8 + sVar17) || (uVar27 == uVar1)) break;
                puVar12 = input_data->Xc_ind;
                puVar26 = puVar12 + uVar27;
                key = key + 1;
                uVar22 = (long)((long)puVar12 + (uVar1 * 8 - (long)puVar26) + 8) >> 3;
                if (0 < (long)uVar22) {
                  do {
                    uVar23 = uVar22 >> 1;
                    uVar19 = ~uVar23 + uVar22;
                    uVar22 = uVar23;
                    if ((puVar26 + uVar23 + 1)[-1] < *key) {
                      puVar26 = puVar26 + uVar23 + 1;
                      uVar22 = uVar19;
                    }
                  } while (0 < (long)uVar22);
                }
LAB_002249d1:
                uVar27 = (long)puVar26 - (long)puVar12 >> 3;
              }
              else {
                if (uVar23 <= uVar22) {
                  puVar26 = puVar12 + uVar27 + 1;
                  uVar23 = (long)((long)puVar12 + (uVar1 * 8 - (long)(puVar12 + uVar27 + 1)) + 8) >>
                           3;
                  while (0 < (long)uVar23) {
                    uVar19 = uVar23 >> 1;
                    uVar18 = ~uVar19 + uVar23;
                    uVar23 = uVar19;
                    if ((puVar26 + uVar19 + 1)[-1] < uVar22) {
                      puVar26 = puVar26 + uVar19 + 1;
                      uVar23 = uVar18;
                    }
                  }
                  goto LAB_002249d1;
                }
                key = key + 1;
                uVar22 = (long)puVar13 - (long)key >> 3;
                while (0 < (long)uVar22) {
                  uVar19 = uVar22 >> 1;
                  uVar18 = ~uVar19 + uVar22;
                  uVar22 = uVar19;
                  if ((key + uVar19 + 1)[-1] < uVar23) {
                    key = key + uVar19 + 1;
                    uVar22 = uVar18;
                  }
                }
              }
              puVar13 = puVar20 + sVar17;
              if (((key == puVar13) ||
                  ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    *)uVar27 == prVar30)) || (uVar22 = *key, uVar25 < uVar22)) break;
            } while( true );
          }
          sVar14 = input_data->ncols_numeric;
        }
        pdVar3 = (local_a0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[uVar11] =
             pdVar3[uVar11] /
             (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar11 < sVar14);
    }
  }
  auVar42._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar42._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar42._12_4_ = 0x45300000;
  dVar33 = (auVar42._8_8_ - 1.9342813113834067e+25) + (auVar42._0_8_ - 4503599627370496.0);
  pdVar3 = (local_a0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((local_a0->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar3) &&
     (sVar14 = input_data->ncols_numeric, sVar14 != 0)) {
    pdVar4 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar17 = local_a0->parent;
    pIVar5 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar21 = 0;
    do {
      pdVar34 = pdVar4 + sVar21;
      if (*pdVar34 <= dVar33 && dVar33 != *pdVar34) {
        dVar52 = *(double *)
                  (*(long *)&pIVar5[sVar17].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar21 * 8);
        dVar49 = 2.0;
        sVar29 = sVar17;
        if (0x7fefffffffffffff < (ulong)ABS(dVar52)) {
          lVar24 = 2;
          do {
            if (sVar29 == 0) {
              pdVar3[sVar21] = NAN;
              dVar49 = 0.0;
              goto LAB_00224b6b;
            }
            sVar29 = pIVar5[sVar29].parent;
            dVar52 = *(double *)
                      (*(long *)&pIVar5[sVar29].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar21 * 8);
            lVar24 = lVar24 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar52));
          auVar53._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar53._0_8_ = lVar24;
          auVar53._12_4_ = 0x45300000;
          dVar49 = (auVar53._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
        }
        pdVar3[sVar21] =
             dVar52 / *(double *)
                       (*(long *)&pIVar5[sVar29].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar21 * 8);
        dVar49 = dVar35 / dVar49;
LAB_00224b6b:
        pdVar4[sVar21] = dVar49;
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar14);
  }
  pvVar16 = (local_a0->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((local_a0->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar16) &&
     (sVar14 = input_data->ncols_categ, sVar14 != 0)) {
    pdVar4 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar17 = local_a0->parent;
    pIVar5 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = input_data->ncat;
    sVar21 = 0;
    do {
      if (dVar33 <= pdVar4[sVar21]) {
        pdVar41 = pvVar16[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pdVar34 = pvVar16[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar34 != pdVar41; pdVar34 = pdVar34 + 1)
        {
          *pdVar34 = *pdVar34 / pdVar4[sVar21];
        }
      }
      else {
        lVar24 = *(long *)&pIVar5[sVar17].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar52 = 2.0;
        sVar29 = sVar17;
        if (*(double *)(lVar24 + sVar21 * 8) <= 0.0) {
          lVar31 = 2;
          do {
            if (sVar29 == 0) goto LAB_00224cb9;
            sVar29 = pIVar5[sVar29].parent;
            lVar24 = *(long *)&pIVar5[sVar29].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar31 = lVar31 + 2;
          } while (*(double *)(lVar24 + sVar21 * 8) <= 0.0);
          auVar50._8_4_ = (int)((ulong)lVar31 >> 0x20);
          auVar50._0_8_ = lVar31;
          auVar50._12_4_ = 0x45300000;
          dVar52 = (auVar50._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar31) - 4503599627370496.0);
        }
        iVar39 = piVar10[sVar21];
        if (0 < (long)iVar39) {
          lVar31 = *(long *)(*(long *)&pIVar5[sVar29].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar21 * 0x18);
          pdVar6 = pvVar16[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar28 = 0;
          do {
            dVar49 = *(double *)(lVar31 + lVar28 * 8);
            dVar54 = 0.0;
            if (0.0 < dVar49) {
              dVar54 = dVar49 / *(double *)(lVar24 + sVar21 * 8);
            }
            pdVar6[lVar28] = dVar54 + pdVar6[lVar28];
            pdVar4[sVar21] = dVar35 / dVar52;
            lVar28 = lVar28 + 1;
          } while (iVar39 != lVar28);
        }
LAB_00224cb9:
        dVar52 = 0.0;
        for (pdVar34 = pvVar16[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar34 !=
            pvVar16[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar34 = pdVar34 + 1) {
          dVar52 = dVar52 + *pdVar34;
        }
        pdVar4[sVar21] = dVar52;
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar14);
  }
  WVar2 = local_40->weigh_imp_rows;
  if (WVar2 == Flat) {
    pdVar41 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 / dVar35;
    }
    pdVar41 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 / dVar35;
    }
  }
  else if (WVar2 == Inverse) {
    pdVar41 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 / (SQRT(dVar35) * dVar35);
    }
    pdVar41 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 / (SQRT(dVar35) * dVar35);
    }
  }
  lVar24 = local_48 + 1;
  auVar43._8_4_ = (int)((ulong)lVar24 >> 0x20);
  auVar43._0_8_ = lVar24;
  auVar43._12_4_ = 0x45300000;
  dVar35 = (auVar43._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
  if (local_40->depth_imp == Higher) {
    pdVar41 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 * dVar35;
    }
    pdVar41 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 * dVar35;
    }
  }
  else if (local_40->depth_imp == Lower) {
    pdVar41 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 / dVar35;
    }
    pdVar41 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pdVar34 = (local_a0->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar41;
        pdVar34 = pdVar34 + 1) {
      *pdVar34 = *pdVar34 / dVar35;
    }
  }
  if ((WVar2 != Prop) || (local_40->depth_imp != Same)) {
    sVar14 = input_data->ncols_numeric;
    if (sVar14 != 0) {
      pdVar4 = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar17 = 0;
      do {
        pdVar3[sVar17] = pdVar4[sVar17] * pdVar3[sVar17];
        sVar17 = sVar17 + 1;
      } while (sVar14 != sVar17);
    }
    sVar14 = input_data->ncols_categ;
    if (sVar14 != 0) {
      piVar10 = input_data->ncat;
      pdVar3 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar17 = 0;
      do {
        iVar39 = piVar10[sVar17];
        if (0 < (long)iVar39) {
          pdVar4 = pvVar16[sVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar24 = 0;
          do {
            pdVar4[lVar24] = pdVar3[sVar17] * pdVar4[lVar24];
            lVar24 = lVar24 + 1;
          } while (iVar39 != lVar24);
        }
        sVar17 = sVar17 + 1;
      } while (sVar17 != sVar14);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}